

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket-server.c
# Opt level: O2

int main(void)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  char *__s;
  int length;
  sockaddr_in name;
  char buf [1024];
  
  __fd = socket(2,2,0);
  if (__fd < 0) {
    __s = "opening datagram socket";
  }
  else {
    name.sin_family = 2;
    name.sin_port = 0;
    name.sin_addr.s_addr = 0;
    iVar1 = bind(__fd,(sockaddr *)&name,0x10);
    if (iVar1 == 0) {
      length = 0x10;
      iVar1 = getsockname(__fd,(sockaddr *)&name,(socklen_t *)&length);
      if (iVar1 == 0) {
        printf("Socket has port #%d\n",(ulong)(ushort)(name.sin_port << 8 | name.sin_port >> 8));
        sVar2 = read(__fd,buf,0x400);
        if (sVar2 < 0) {
          perror("receiving datagram packet");
        }
        printf("-->%s\n",buf);
        close(__fd);
        return 0;
      }
      __s = "getting socket name";
    }
    else {
      __s = "binding datagram socket";
    }
  }
  perror(__s);
  exit(1);
}

Assistant:

int main()
{
    int sock, length;
    struct sockaddr_in name;
    char buf[1024];

    /* Create socket from which to read. */
    sock = socket(AF_INET, SOCK_DGRAM, 0);
    if (sock < 0) {
        perror("opening datagram socket");
        exit(1);
    }
    /* Create name with wildcards. */
    name.sin_family = AF_INET;
    name.sin_addr.s_addr = INADDR_ANY;
    name.sin_port = 0;
    if (bind(sock, (struct sockaddr *)&name, sizeof(name))) {
        perror("binding datagram socket");
        exit(1);
    }
    /* Find assigned port value and print it out. */
    length = sizeof(name);
    if (getsockname(sock, (struct sockaddr *)&name, &length)) {
        perror("getting socket name");
        exit(1);
    }
    printf("Socket has port #%d\n", ntohs(name.sin_port));
    /* Read from the socket */
    if (read(sock, buf, sizeof(buf)) < 0)
        perror("receiving datagram packet");
    printf("-->%s\n", buf);
    close(sock);
    return 0;
}